

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectConstant<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t iVar6;
  sel_t sVar7;
  
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    uVar2 = *(ulong *)((long)right->data + 8);
    uVar3 = *(ulong *)((long)left->data + 8);
    if (((long)uVar2 <= (long)uVar3) &&
       (*(ulong *)right->data <= *(ulong *)left->data || uVar2 != uVar3)) {
      if (count != 0 && true_sel != (SelectionVector *)0x0) {
        psVar4 = sel->sel_vector;
        psVar5 = true_sel->sel_vector;
        iVar6 = 0;
        do {
          sVar7 = (sel_t)iVar6;
          if (psVar4 != (sel_t *)0x0) {
            sVar7 = psVar4[iVar6];
          }
          psVar5[iVar6] = sVar7;
          iVar6 = iVar6 + 1;
        } while (count != iVar6);
      }
      return count;
    }
  }
  if (count != 0 && false_sel != (SelectionVector *)0x0) {
    psVar4 = sel->sel_vector;
    psVar5 = false_sel->sel_vector;
    iVar6 = 0;
    do {
      sVar7 = (sel_t)iVar6;
      if (psVar4 != (sel_t *)0x0) {
        sVar7 = psVar4[iVar6];
      }
      psVar5[iVar6] = sVar7;
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return 0;
}

Assistant:

static idx_t SelectConstant(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                            SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);

		// both sides are constant, return either 0 or the count
		// in this case we do not fill in the result selection vector at all
		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right) || !OP::Operation(*ldata, *rdata)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		} else {
			if (true_sel) {
				for (idx_t i = 0; i < count; i++) {
					true_sel->set_index(i, sel->get_index(i));
				}
			}
			return count;
		}
	}